

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void dekkerMul2(double *x,double y,double yy)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double cc;
  double c;
  double q;
  double p;
  double ty;
  double tx;
  
  dVar1 = (double)((ulong)*x & 0xfffffffffc000000);
  dVar2 = (double)((ulong)y & 0xfffffffffc000000);
  dVar3 = dVar2 * (*x - dVar1) + dVar1 * (y - dVar2);
  dVar4 = dVar1 * dVar2 + dVar3;
  dVar1 = y * x[1] + yy * *x + (*x - dVar1) * (y - dVar2) + (dVar1 * dVar2 - dVar4) + dVar3;
  *x = dVar4 + dVar1;
  x[1] = dVar4 - *x;
  x[1] = dVar1 + x[1];
  return;
}

Assistant:

static void dekkerMul2(volatile double *x, double y, double yy){
  /*
  ** The "volatile" keywords on parameter x[] and on local variables
  ** below are needed force intermediate results to be truncated to
  ** binary64 rather than be carried around in an extended-precision
  ** format.  The truncation is necessary for the Dekker algorithm to
  ** work.  Intel x86 floating point might omit the truncation without
  ** the use of volatile.
  */
  volatile double tx, ty, p, q, c, cc;
  double hx, hy;
  u64 m;
  memcpy(&m, (void*)&x[0], 8);
  m &= 0xfffffffffc000000LL;
  memcpy(&hx, &m, 8);
  tx = x[0] - hx;
  memcpy(&m, &y, 8);
  m &= 0xfffffffffc000000LL;
  memcpy(&hy, &m, 8);
  ty = y - hy;
  p = hx*hy;
  q = hx*ty + tx*hy;
  c = p+q;
  cc = p - c + q + tx*ty;
  cc = x[0]*yy + x[1]*y + cc;
  x[0] = c + cc;
  x[1] = c - x[0];
  x[1] += cc;
}